

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.cpp
# Opt level: O3

void __thiscall E64::core_t::do_sound_and_timers(core_t *this,uint32_t cycles)

{
  undefined1 *puVar1;
  int iVar2;
  char *pcVar3;
  uint32_t number_of_cycles;
  
  number_of_cycles = cycles;
  if ((this->current_mode == RUN) && (number_of_cycles = 0, cycles != 0)) {
    do {
      if (this->field_0x98 == '\x01') {
        puVar1 = &this->field_0x90;
        *(long *)puVar1 = *(long *)puVar1 + -1;
        if (*(long *)puVar1 == 0) {
          if (this->field_0x99 == '\x01') {
            this->field_0x98 = 0;
          }
          else {
            *(undefined8 *)&this->field_0x90 = *(undefined8 *)&this->field_0x88;
          }
          sound_ic::run(this->sound,number_of_cycles,this->host);
          lua_getglobal(this->L,"timer0_callback");
          number_of_cycles = 0;
          iVar2 = lua_pcallk(this->L,0,0,0,0,(lua_KFunction)0x0);
          if (iVar2 != 0) {
            number_of_cycles = 0;
            pcVar3 = lua_tolstring(this->L,-1,(size_t *)0x0);
            printf("[core] Lua error: %s",pcVar3);
          }
        }
      }
      if (this->field_0xb0 == '\x01') {
        puVar1 = &this->field_0xa8;
        *(long *)puVar1 = *(long *)puVar1 + -1;
        if (*(long *)puVar1 == 0) {
          if (this->field_0xb1 == '\x01') {
            this->field_0xb0 = 0;
          }
          else {
            *(undefined8 *)&this->field_0xa8 = *(undefined8 *)&this->field_0xa0;
          }
          sound_ic::run(this->sound,number_of_cycles,this->host);
          lua_getglobal(this->L,"timer1_callback");
          number_of_cycles = 0;
          iVar2 = lua_pcallk(this->L,0,0,0,0,(lua_KFunction)0x0);
          if (iVar2 != 0) {
            number_of_cycles = 0;
            pcVar3 = lua_tolstring(this->L,-1,(size_t *)0x0);
            printf("[core] Lua error: %s",pcVar3);
          }
        }
      }
      if (this->field_0xc8 == '\x01') {
        puVar1 = &this->field_0xc0;
        *(long *)puVar1 = *(long *)puVar1 + -1;
        if (*(long *)puVar1 == 0) {
          if (this->field_0xc9 == '\x01') {
            this->field_0xc8 = 0;
          }
          else {
            *(undefined8 *)&this->field_0xc0 = *(undefined8 *)&this->field_0xb8;
          }
          sound_ic::run(this->sound,number_of_cycles,this->host);
          lua_getglobal(this->L,"timer2_callback");
          number_of_cycles = 0;
          iVar2 = lua_pcallk(this->L,0,0,0,0,(lua_KFunction)0x0);
          if (iVar2 != 0) {
            number_of_cycles = 0;
            pcVar3 = lua_tolstring(this->L,-1,(size_t *)0x0);
            printf("[core] Lua error: %s",pcVar3);
          }
        }
      }
      if (this->field_0xe0 == '\x01') {
        puVar1 = &this->field_0xd8;
        *(long *)puVar1 = *(long *)puVar1 + -1;
        if (*(long *)puVar1 == 0) {
          if (this->field_0xe1 == '\x01') {
            this->field_0xe0 = 0;
          }
          else {
            *(undefined8 *)&this->field_0xd8 = *(undefined8 *)&this->field_0xd0;
          }
          sound_ic::run(this->sound,number_of_cycles,this->host);
          lua_getglobal(this->L,"timer3_callback");
          number_of_cycles = 0;
          iVar2 = lua_pcallk(this->L,0,0,0,0,(lua_KFunction)0x0);
          if (iVar2 != 0) {
            number_of_cycles = 0;
            pcVar3 = lua_tolstring(this->L,-1,(size_t *)0x0);
            printf("[core] Lua error: %s",pcVar3);
          }
        }
      }
      if (this->field_0xf8 == '\x01') {
        puVar1 = &this->field_0xf0;
        *(long *)puVar1 = *(long *)puVar1 + -1;
        if (*(long *)puVar1 == 0) {
          if (this->field_0xf9 == '\x01') {
            this->field_0xf8 = 0;
          }
          else {
            *(undefined8 *)&this->field_0xf0 = *(undefined8 *)&this->field_0xe8;
          }
          sound_ic::run(this->sound,number_of_cycles,this->host);
          lua_getglobal(this->L,"timer4_callback");
          number_of_cycles = 0;
          iVar2 = lua_pcallk(this->L,0,0,0,0,(lua_KFunction)0x0);
          if (iVar2 != 0) {
            number_of_cycles = 0;
            pcVar3 = lua_tolstring(this->L,-1,(size_t *)0x0);
            printf("[core] Lua error: %s",pcVar3);
          }
        }
      }
      if (this->field_0x110 == '\x01') {
        puVar1 = &this->field_0x108;
        *(long *)puVar1 = *(long *)puVar1 + -1;
        if (*(long *)puVar1 == 0) {
          if (this->field_0x111 == '\x01') {
            this->field_0x110 = 0;
          }
          else {
            *(undefined8 *)&this->field_0x108 = *(undefined8 *)&this->field_0x100;
          }
          sound_ic::run(this->sound,number_of_cycles,this->host);
          lua_getglobal(this->L,"timer5_callback");
          number_of_cycles = 0;
          iVar2 = lua_pcallk(this->L,0,0,0,0,(lua_KFunction)0x0);
          if (iVar2 != 0) {
            number_of_cycles = 0;
            pcVar3 = lua_tolstring(this->L,-1,(size_t *)0x0);
            printf("[core] Lua error: %s",pcVar3);
          }
        }
      }
      if (this->field_0x128 == '\x01') {
        puVar1 = &this->field_0x120;
        *(long *)puVar1 = *(long *)puVar1 + -1;
        if (*(long *)puVar1 == 0) {
          if (this->field_0x129 == '\x01') {
            this->field_0x128 = 0;
          }
          else {
            *(undefined8 *)&this->field_0x120 = *(undefined8 *)&this->field_0x118;
          }
          sound_ic::run(this->sound,number_of_cycles,this->host);
          lua_getglobal(this->L,"timer6_callback");
          number_of_cycles = 0;
          iVar2 = lua_pcallk(this->L,0,0,0,0,(lua_KFunction)0x0);
          if (iVar2 != 0) {
            number_of_cycles = 0;
            pcVar3 = lua_tolstring(this->L,-1,(size_t *)0x0);
            printf("[core] Lua error: %s",pcVar3);
          }
        }
      }
      if (this->field_0x140 == '\x01') {
        puVar1 = &this->field_0x138;
        *(long *)puVar1 = *(long *)puVar1 + -1;
        if (*(long *)puVar1 == 0) {
          if (this->field_0x141 == '\x01') {
            this->field_0x140 = 0;
          }
          else {
            *(undefined8 *)&this->field_0x138 = *(undefined8 *)&this->field_0x130;
          }
          sound_ic::run(this->sound,number_of_cycles,this->host);
          lua_getglobal(this->L,"timer7_callback");
          number_of_cycles = 0;
          iVar2 = lua_pcallk(this->L,0,0,0,0,(lua_KFunction)0x0);
          if (iVar2 != 0) {
            number_of_cycles = 0;
            pcVar3 = lua_tolstring(this->L,-1,(size_t *)0x0);
            printf("[core] Lua error: %s",pcVar3);
          }
        }
      }
      cycles = cycles - 1;
      number_of_cycles = number_of_cycles + 1;
    } while (cycles != 0);
  }
  sound_ic::run(this->sound,number_of_cycles,this->host);
  return;
}

Assistant:

void E64::core_t::do_sound_and_timers(uint32_t cycles)
{
	uint32_t cycles_done = 0;
	
	if (current_mode == RUN) {
		while (cycles--) {
			if (timer[0].clock()) {
				sound->run(cycles_done, host);
				cycles_done = 0;
				lua_getglobal(L, "timer0_callback");
				if (lua_pcall(L, 0, 0, 0)) {
					printf("[core] Lua error: %s", lua_tostring(L, -1));
				}
			}
			if (timer[1].clock()) {
				sound->run(cycles_done, host);
				cycles_done = 0;
				lua_getglobal(L, "timer1_callback");
				if (lua_pcall(L, 0, 0, 0)) {
					printf("[core] Lua error: %s", lua_tostring(L, -1));
				}
			}
			if (timer[2].clock()) {
				sound->run(cycles_done, host);
				cycles_done = 0;
				lua_getglobal(L, "timer2_callback");
				if (lua_pcall(L, 0, 0, 0)) {
					printf("[core] Lua error: %s", lua_tostring(L, -1));
				}
			}
			if (timer[3].clock()) {
				sound->run(cycles_done, host);
				cycles_done = 0;
				lua_getglobal(L, "timer3_callback");
				if (lua_pcall(L, 0, 0, 0)) {
					printf("[core] Lua error: %s", lua_tostring(L, -1));
				}
			}
			if (timer[4].clock()) {
				sound->run(cycles_done, host);
				cycles_done = 0;
				lua_getglobal(L, "timer4_callback");
				if (lua_pcall(L, 0, 0, 0)) {
					printf("[core] Lua error: %s", lua_tostring(L, -1));
				}
			}
			if (timer[5].clock()) {
				sound->run(cycles_done, host);
				cycles_done = 0;
				lua_getglobal(L, "timer5_callback");
				if (lua_pcall(L, 0, 0, 0)) {
					printf("[core] Lua error: %s", lua_tostring(L, -1));
				}
			}
			if (timer[6].clock()) {
				sound->run(cycles_done, host);
				cycles_done = 0;
				lua_getglobal(L, "timer6_callback");
				if (lua_pcall(L, 0, 0, 0)) {
					printf("[core] Lua error: %s", lua_tostring(L, -1));
				}
			}
			if (timer[7].clock()) {
				sound->run(cycles_done, host);
				cycles_done = 0;
				lua_getglobal(L, "timer7_callback");
				if (lua_pcall(L, 0, 0, 0)) {
					printf("[core] Lua error: %s", lua_tostring(L, -1));
				}
			}
			cycles_done++;
		}
	} else {
		cycles_done = cycles;
	}
	
	sound->run(cycles_done, host);
}